

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall
LastVal<BoolView,_bool>::LastVal(LastVal<BoolView,_bool> *this,BoolView *_x,bool *_v)

{
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_001f2ee0;
  this->x = _x;
  this->v = _v;
  (this->super_Propagator).priority = 0;
  BoolView::attach(_x,&this->super_Propagator,0,8);
  return;
}

Assistant:

LastVal(Var* _x, Val* _v) : x(_x), v(_v) {
		priority = 0;
		x->attach(this, 0, EVENT_F);
	}